

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_subgraph.cpp
# Opt level: O3

void __thiscall
Disa::Adjacency_Subgraph::Adjacency_Subgraph
          (Adjacency_Subgraph *this,Adjacency_Graph<false> *parent_graph,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *i_partition_local_global,
          size_t extra_levels)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  pointer puVar1;
  long lVar2;
  source_location *psVar3;
  iterator __position;
  Adjacency_Graph<false> *__x;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_01;
  uint uVar4;
  iterator __beg;
  size_t sVar5;
  ulong *puVar6;
  unsigned_long uVar7;
  ostream *poVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  uint uVar10;
  uint uVar11;
  source_location *psVar12;
  long lVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong *puVar18;
  ulong uVar19;
  pointer puVar20;
  pointer puVar21;
  pointer puVar22;
  pointer puVar23;
  uint uVar24;
  ulong *puVar25;
  ulong uVar26;
  source_location *psVar27;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  unsigned_long uVar31;
  unsigned_long *puVar32;
  size_type sVar33;
  bool bVar34;
  vector<unsigned_long,_std::allocator<unsigned_long>_> i_global_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> unique_check;
  vector<unsigned_long,_std::allocator<unsigned_long>_> new_indexes;
  undefined1 local_218 [32];
  pointer local_1f8;
  pointer puStack_1f0;
  Adjacency_Graph<false> *local_1e0;
  Adjacency_Graph<false> *local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  pointer local_1b0;
  long local_1a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  void *local_168;
  long lStack_160;
  long local_158;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_150;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_148;
  size_t local_140;
  unsigned_long local_138;
  pointer local_130;
  shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_128;
  string local_118;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  ulong local_c0;
  pointer local_b8;
  pointer local_b0;
  undefined8 local_a8;
  ulong local_a0;
  string local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined **local_38;
  
  local_1f8 = (pointer)0x0;
  puStack_1f0 = (pointer)0x0;
  local_218._16_8_ = (pointer)0x0;
  local_218._24_8_ = (pointer)0x0;
  local_218._0_8_ = (pointer)0x0;
  local_218._8_8_ = (pointer)0x0;
  local_1e0 = parent_graph;
  local_140 = extra_levels;
  sVar5 = std::hash<Disa::Adjacency_Graph<false>_>::operator()
                    ((hash<Disa::Adjacency_Graph<false>_> *)&local_1d0,
                     (Adjacency_Graph<false> *)local_218);
  Adjacency_Graph<false>::~Adjacency_Graph((Adjacency_Graph<false> *)local_218);
  this->hash_parent = sVar5;
  local_1d8 = &this->graph;
  local_148 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->i_local_global;
  local_150 = &this->level_set_value;
  (this->graph).vertex_adjacent_list.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->graph).vertex_adjacent_list.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->graph).vertex_adjacent_list.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->graph).offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->graph).offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->graph).offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->i_local_global).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->i_local_global).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->i_local_global).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->level_set_value).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->level_set_value).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->level_set_value).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168 = (void *)0x0;
  lStack_160 = 0;
  local_158 = 0;
  puVar6 = (i_partition_local_global->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar18 = (i_partition_local_global->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (puVar6 == puVar18) {
    psVar27 = (source_location *)0x0;
    puVar18 = puVar6;
  }
  else {
    std::
    __unique_copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::back_insert_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
              (puVar6,puVar18,&local_168);
    puVar6 = (i_partition_local_global->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    psVar27 = (source_location *)(lStack_160 - (long)local_168);
    puVar18 = (i_partition_local_global->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
  }
  __x = local_1e0;
  psVar12 = (source_location *)((long)puVar6 - (long)puVar18);
  if (psVar27 == psVar12) {
    psVar12 = (source_location *)
              (local_1e0->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    psVar3 = (source_location *)
             (local_1e0->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar19 = ((long)psVar3 - (long)psVar12 >> 3) - 1;
    uVar17 = 0;
    if (psVar3 != psVar12) {
      uVar17 = uVar19;
    }
    if ((ulong)((long)psVar27 >> 3) <= uVar17) {
      if (0 < (long)psVar27 >> 5) {
        puVar25 = (ulong *)(((ulong)psVar27 & 0xffffffffffffffe0) + (long)puVar18);
        lVar29 = ((long)psVar27 >> 5) + 1;
        puVar18 = puVar18 + 2;
        do {
          if ((psVar12 == psVar3) || (uVar19 <= puVar18[-2])) {
            puVar18 = puVar18 + -2;
            goto LAB_001110e6;
          }
          if (uVar19 <= puVar18[-1]) {
            puVar18 = puVar18 + -1;
            goto LAB_001110e6;
          }
          if (uVar19 <= *puVar18) goto LAB_001110e6;
          if (uVar19 <= puVar18[1]) {
            puVar18 = puVar18 + 1;
            goto LAB_001110e6;
          }
          lVar29 = lVar29 + -1;
          puVar18 = puVar18 + 4;
        } while (1 < lVar29);
        psVar27 = (source_location *)((long)puVar6 - (long)puVar25);
        puVar18 = puVar25;
      }
      lVar29 = (long)psVar27 >> 3;
      puVar25 = puVar18;
      if (lVar29 == 1) {
LAB_001110be:
        puVar18 = puVar6;
        if (uVar19 <= *puVar25) {
          puVar18 = puVar25;
        }
        if (psVar12 == psVar3) {
          puVar18 = puVar25;
        }
LAB_001110e6:
        if (puVar18 != puVar6) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
          local_e0._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_00160a20;
          console_format_abi_cxx11_
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
                     (Disa *)0x0,(Log_Level)&local_e0,psVar12);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)local_218._0_8_,local_218._8_8_);
          puVar21 = (local_1e0->offset).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          puVar20 = (local_1e0->offset).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar31 = 0;
          if (puVar21 != puVar20) {
            uVar31 = ((long)puVar21 - (long)puVar20 >> 3) - 1;
          }
          std::__cxx11::to_string(&local_118,uVar31);
          std::operator+(&local_188,"A global vertex is not in the parsed parent graph range [0, ",
                         &local_118);
          pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_188,").");
          local_1d0._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
          paVar14 = &pbVar9->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p == paVar14) {
            local_1d0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_1d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          }
          else {
            local_1d0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          }
          local_1d0._M_string_length = pbVar9->_M_string_length;
          (pbVar9->_M_dataplus)._M_p = (pointer)paVar14;
          pbVar9->_M_string_length = 0;
          (pbVar9->field_2)._M_local_buf[0] = '\0';
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
          std::endl<char,std::char_traits<char>>(poVar8);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::~string((string *)&local_188);
          std::__cxx11::string::~string((string *)&local_118);
          goto LAB_00111a7a;
        }
      }
      else {
        if (lVar29 == 2) {
LAB_001110b0:
          if ((psVar12 != psVar3) && (*puVar18 < uVar19)) {
            puVar25 = puVar18 + 1;
            goto LAB_001110be;
          }
          goto LAB_001110e6;
        }
        if (lVar29 == 3) {
          if ((psVar12 != psVar3) && (*puVar18 < uVar19)) {
            puVar18 = puVar18 + 1;
            goto LAB_001110b0;
          }
          goto LAB_001110e6;
        }
      }
      sVar5 = std::hash<Disa::Adjacency_Graph<false>_>::operator()
                        ((hash<Disa::Adjacency_Graph<false>_> *)local_218,local_1e0);
      this->hash_parent = sVar5;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&local_1d8->vertex_adjacent_list,&__x->vertex_adjacent_list);
      this_00 = &(this->graph).offset;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(this_00,&__x->offset);
      sVar33 = (long)(i_partition_local_global->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(i_partition_local_global->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(this_00,sVar33 + 1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                (&local_1d8->vertex_adjacent_list,0);
      this_01 = local_148;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_148,sVar33);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(local_150,sVar33);
      puVar21 = (__x->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      puVar20 = (__x->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      sVar33 = 0;
      if (puVar21 != puVar20) {
        sVar33 = ((long)puVar21 - (long)puVar20 >> 3) - 1;
      }
      local_218._0_8_ = (pointer)0xffffffffffffffff;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_1a0,sVar33,(value_type_conflict *)local_218,(allocator_type *)&local_1d0);
      puVar21 = (i_partition_local_global->
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
      puVar20 = (i_partition_local_global->
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (puVar21 != puVar20) {
        lVar29 = 0;
        uVar31 = 0;
        do {
          __position._M_current =
               (this->i_local_global).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->i_local_global).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      (this_01,__position,(unsigned_long *)((long)puVar21 + lVar29));
            uVar7 = puVar21[uVar31];
          }
          else {
            uVar7 = puVar21[uVar31];
            *__position._M_current = uVar7;
            (this->i_local_global).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          local_1a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar7] = uVar31;
          uVar31 = uVar31 + 1;
          lVar15 = lVar29 + 8;
          lVar29 = lVar29 + 8;
        } while ((pointer)((long)puVar21 + lVar15) != puVar20);
      }
      local_1d0._M_dataplus._M_p = local_1d0._M_dataplus._M_p & 0xffffffffffffff00;
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)local_218,
                 (long)(this->graph).vertex_adjacent_list.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->graph).vertex_adjacent_list.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3,(bool *)&local_1d0,
                 (allocator_type *)&local_188);
      local_1d0._M_dataplus._M_p = (pointer)0xffffffffffffffff;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_f8,
                 (long)(this->graph).vertex_adjacent_list.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->graph).vertex_adjacent_list.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3,(value_type_conflict *)&local_1d0,
                 (allocator_type *)&local_188);
      local_1b0 = (this->graph).offset.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_b8 = (this->graph).offset.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      local_c0 = (long)local_b8 - (long)local_1b0;
      uVar17 = ((long)local_c0 >> 3) - 1;
      if (uVar17 == 0 || local_c0 == 0) {
        lVar29 = 0;
      }
      else {
        puVar21 = (local_1d8->vertex_adjacent_list).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_b0 = local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        local_a8 = 0x800000000000003f;
        uVar19 = 0;
        local_138 = 0;
        local_130 = (pointer)local_218._0_8_;
        lVar29 = 0;
        do {
          local_1a8 = lVar29;
          uVar16 = local_1b0[uVar19];
          uVar30 = local_1b0[uVar19 + 1];
          uVar26 = uVar16 + 0x3f;
          if (-1 < (long)uVar16) {
            uVar26 = uVar16;
          }
          lVar15 = uVar16 * 8;
          puVar18 = (ulong *)(local_218._0_8_ +
                             (ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                             ((long)uVar26 >> 6) * 8 + -8);
          uVar4 = (uint)uVar16 & 0x3f;
          uVar26 = uVar30 + 0x3f;
          if (-1 < (long)uVar30) {
            uVar26 = uVar30;
          }
          local_1b0[uVar19] = uVar16 - local_1a8;
          lVar2 = uVar30 * 8;
          uVar28 = 0;
          if (local_1a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar19] == 0xffffffffffffffff) {
            uVar24 = (uint)uVar30 & 0x3f;
            lVar29 = (long)(lVar2 + uVar16 * -8) >> 3;
            puVar6 = puVar18;
            uVar10 = uVar4;
            if (puVar18 !=
                (ulong *)(local_218._0_8_ +
                         (ulong)((uVar30 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                         ((long)uVar26 >> 6) * 8 + -8) || uVar4 != uVar24) {
              do {
                *puVar18 = *puVar18 | 1L << ((byte)uVar10 & 0x3f);
                bVar34 = uVar4 == 0x3f;
                puVar6 = puVar6 + bVar34;
                uVar4 = uVar4 + 1;
                if (bVar34) {
                  uVar4 = uVar28;
                }
                uVar11 = uVar10 + 1;
                if (uVar10 == 0x3f) {
                  uVar11 = uVar28;
                }
                puVar18 = puVar18 + (uVar10 == 0x3f);
                uVar10 = uVar11;
              } while ((puVar6 != (ulong *)(local_218._0_8_ +
                                           (ulong)((uVar30 & 0x800000000000003f) <
                                                  0x8000000000000001) * 8 + ((long)uVar26 >> 6) * 8
                                           + -8)) || (uVar4 != uVar24));
            }
          }
          else {
            local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar19] = local_138;
            local_138 = local_138 + 1;
            if (uVar16 == uVar30) {
              lVar29 = 0;
            }
            else {
              lVar29 = 0;
              lVar13 = lVar15;
              do {
                lVar29 = lVar29 + (ulong)(local_1a0.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start
                                          [*(long *)((long)puVar21 + lVar13)] == 0xffffffffffffffff)
                ;
                lVar13 = lVar13 + 8;
              } while (lVar2 - lVar13 != 0);
              do {
                uVar16 = 1L << ((byte)uVar4 & 0x3f);
                if (local_1a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[*(long *)((long)puVar21 + lVar15)] ==
                    0xffffffffffffffff) {
                  uVar16 = uVar16 | *puVar18;
                }
                else {
                  uVar16 = ~uVar16 & *puVar18;
                }
                *puVar18 = uVar16;
                bVar34 = uVar4 == 0x3f;
                uVar4 = uVar4 + 1;
                if (bVar34) {
                  uVar4 = uVar28;
                }
                puVar18 = puVar18 + bVar34;
                lVar15 = lVar15 + 8;
              } while (lVar2 - lVar15 != 0);
            }
          }
          lVar29 = lVar29 + local_1a8;
          uVar19 = uVar19 + 1;
          local_a0 = uVar17;
        } while (uVar19 != uVar17);
      }
      local_b8[-1] = local_b8[-1] - lVar29;
      puVar21 = local_1b0;
      puVar32 = local_b8;
      if ((long)local_c0 >> 5 < 1) {
        uVar19 = 0;
        uVar16 = local_c0;
      }
      else {
        puVar20 = (pointer)((local_c0 & 0xffffffffffffffe0) + (long)local_1b0);
        lVar29 = ((long)local_c0 >> 5) + 1;
        uVar16 = 0;
        uVar19 = 0;
        do {
          uVar30 = uVar19;
          if (((local_1b0 != local_b8) && (uVar19 < uVar17)) &&
             (uVar16 = uVar19 + 1, uVar30 = uVar16,
             local_1a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar19] == 0xffffffffffffffff)) goto LAB_00111673;
          uVar19 = uVar30;
          if (((local_1b0 != local_b8) && (uVar30 < uVar17)) &&
             (uVar16 = uVar30 + 1, uVar19 = uVar16,
             local_1a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar30] == 0xffffffffffffffff)) {
            puVar21 = puVar21 + 1;
            goto LAB_00111673;
          }
          uVar30 = uVar19;
          if (((local_1b0 != local_b8) && (uVar19 < uVar17)) &&
             (uVar16 = uVar19 + 1, uVar30 = uVar16,
             local_1a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar19] == 0xffffffffffffffff)) {
            puVar21 = puVar21 + 2;
            goto LAB_00111673;
          }
          uVar19 = uVar30;
          if (((local_1b0 != local_b8) && (uVar30 < uVar17)) &&
             (uVar16 = uVar30 + 1, uVar19 = uVar16,
             local_1a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar30] == 0xffffffffffffffff)) {
            puVar21 = puVar21 + 3;
            goto LAB_00111673;
          }
          puVar21 = puVar21 + 4;
          lVar29 = lVar29 + -1;
        } while (1 < lVar29);
        uVar19 = uVar16;
        uVar16 = (long)local_b8 - (long)puVar20;
        puVar21 = puVar20;
      }
      lVar29 = (long)uVar16 >> 3;
      if (lVar29 == 1) {
LAB_00111651:
        if ((local_1b0 != local_b8) && (uVar19 < uVar17)) {
          uVar16 = uVar19 + 1;
          if (local_1a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar19] != 0xffffffffffffffff) {
            puVar21 = local_b8;
          }
          goto LAB_00111673;
        }
      }
      else {
        if (lVar29 == 2) {
LAB_00111625:
          if (((local_1b0 == local_b8) || (uVar17 <= uVar19)) ||
             (uVar16 = uVar19 + 1,
             puVar20 = local_1a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar19, uVar19 = uVar16,
             *puVar20 != 0xffffffffffffffff)) {
            puVar21 = puVar21 + 1;
            goto LAB_00111651;
          }
        }
        else {
          if (lVar29 != 3) goto LAB_001116ba;
          if (((local_1b0 == local_b8) || (uVar17 <= uVar19)) ||
             (uVar16 = uVar19 + 1,
             puVar20 = local_1a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar19, uVar19 = uVar16,
             *puVar20 != 0xffffffffffffffff)) {
            puVar21 = puVar21 + 1;
            goto LAB_00111625;
          }
        }
LAB_00111673:
        puVar20 = puVar21;
        if (puVar21 != local_b8) {
          while (puVar20 = puVar20 + 1, puVar20 != local_b8) {
            if (((local_1b0 == local_b8) || (uVar17 <= uVar16)) ||
               (uVar19 = uVar16 + 1,
               puVar1 = local_1a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar16, uVar16 = uVar19,
               *puVar1 != 0xffffffffffffffff)) {
              *puVar21 = *puVar20;
              puVar21 = puVar21 + 1;
            }
          }
          if (puVar21 != local_b8) {
            (this->graph).offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = puVar21;
            puVar32 = puVar21;
          }
        }
      }
LAB_001116ba:
      puVar21 = (this->graph).vertex_adjacent_list.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar20 = (this->graph).vertex_adjacent_list.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
      uVar17 = (long)puVar20 - (long)puVar21;
      lVar29 = (long)uVar17 >> 5;
      puVar23 = puVar21;
      puVar1 = puVar21;
      if (lVar29 < 1) {
        uVar19 = 0;
      }
      else {
        puVar22 = (pointer)((uVar17 & 0xffffffffffffffe0) + (long)puVar21);
        uVar19 = lVar29 * 4;
        lVar29 = lVar29 + 1;
        uVar17 = 4;
        do {
          uVar16 = *(ulong *)(local_218._0_8_ + (uVar17 - 4 >> 6) * 8);
          uVar30 = uVar17 - 3;
          if ((uVar16 >> ((uint)(uVar17 - 4) & 0x3c) & 1) != 0) goto LAB_0011182e;
          if ((uVar16 >> ((uint)(uVar17 - 3) & 0x3d) & 1) != 0) {
            puVar23 = puVar23 + 1;
            uVar30 = uVar17 - 2;
            goto LAB_0011182e;
          }
          if ((uVar16 >> ((uint)(uVar17 - 2) & 0x3e) & 1) != 0) {
            puVar23 = puVar23 + 2;
            uVar30 = uVar17 - 1;
            goto LAB_0011182e;
          }
          if ((uVar16 >> (uVar17 - 1 & 0x3f) & 1) != 0) {
            puVar23 = puVar23 + 3;
            uVar30 = uVar17;
            goto LAB_0011182e;
          }
          puVar23 = puVar23 + 4;
          uVar17 = uVar17 + 4;
          lVar29 = lVar29 + -1;
        } while (1 < lVar29);
        uVar17 = (long)puVar20 - (long)puVar22;
        puVar23 = puVar22;
      }
      lVar29 = (long)uVar17 >> 3;
      if (lVar29 == 3) {
        uVar30 = uVar19 | 1;
        if ((*(ulong *)(local_218._0_8_ + (uVar19 >> 6) * 8) >> ((uint)uVar19 & 0x3c) & 1) == 0) {
          puVar23 = puVar23 + 1;
          uVar19 = uVar19 | 1;
          goto LAB_001117c1;
        }
LAB_0011182e:
        puVar22 = puVar23 + 1;
        if (puVar22 != puVar20 && puVar23 != puVar20) {
          do {
            if ((*(ulong *)(local_218._0_8_ +
                           (ulong)((uVar30 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                           (uVar30 >> 6) * 8 + -8) >> (uVar30 & 0x3f) & 1) == 0) {
              *puVar23 = *puVar22;
              puVar23 = puVar23 + 1;
            }
            puVar22 = puVar22 + 1;
            uVar30 = uVar30 + 1;
          } while (puVar22 != puVar20);
        }
        if (puVar23 != puVar20) {
          (this->graph).vertex_adjacent_list.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar23;
          puVar20 = puVar23;
        }
      }
      else {
        if (lVar29 == 2) {
LAB_001117c1:
          uVar16 = uVar19 >> 6;
          uVar26 = uVar19 & 0x800000000000003f;
          uVar17 = uVar19 & 0x3f;
          uVar19 = uVar19 + 1;
          uVar30 = uVar19;
          if ((*(ulong *)(local_218._0_8_ +
                         (ulong)(uVar26 < 0x8000000000000001) * 8 + uVar16 * 8 + -8) >> uVar17 & 1)
              == 0) {
            puVar23 = puVar23 + 1;
            goto LAB_001117fe;
          }
          goto LAB_0011182e;
        }
        if (lVar29 == 1) {
LAB_001117fe:
          uVar30 = uVar19 + 1;
          if ((*(ulong *)(local_218._0_8_ +
                         (ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                         (uVar19 >> 6) * 8 + -8) >> (uVar19 & 0x3f) & 1) == 0) {
            puVar23 = puVar20;
          }
          goto LAB_0011182e;
        }
      }
      for (; puVar1 != puVar20; puVar1 = puVar1 + 1) {
        *puVar1 = local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[*puVar1];
      }
      psVar27 = (source_location *)((long)puVar20 - (long)puVar21 >> 3);
      if ((source_location *)puVar32[-1] == psVar27) {
        if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_f8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_f8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((pointer)local_218._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_218._0_8_,(long)local_1f8 - local_218._0_8_);
        }
        if (local_140 != 0) {
          local_128.
          super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>&>
                    (&local_128.
                      super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> **)&local_128,
                     (allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                     local_218,&local_1a0);
          update_levels(this,local_1e0,local_140,&local_128);
          if (local_128.
              super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_128.
                       super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        if (local_1a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1a0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1a0.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1a0.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_168 != (void *)0x0) {
          operator_delete(local_168,local_158 - (long)local_168);
        }
        return;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
      local_38 = &PTR_s__workspace_llm4binary_github_lic_00160ac8;
      console_format_abi_cxx11_(&local_1d0,(Disa *)0x0,(Log_Level)&local_38,psVar27);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_1d0._M_dataplus._M_p,
                          local_1d0._M_string_length);
      std::__cxx11::to_string
                (&local_78,
                 (this->graph).offset.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1]);
      std::operator+(&local_58,
                     "Total offsets no longer match vertex size while reducing to subgraph, ",
                     &local_78);
      pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_58," vs. ");
      local_e0._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
      paVar14 = &pbVar9->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p == paVar14) {
        local_e0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      }
      else {
        local_e0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      }
      local_e0._M_string_length = pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::to_string
                (&local_98,
                 (long)(this->graph).vertex_adjacent_list.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->graph).vertex_adjacent_list.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3);
      std::operator+(&local_118,&local_e0,&local_98);
      pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_118,".");
      local_188._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
      paVar14 = &pbVar9->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p == paVar14) {
        local_188.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_188.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      }
      else {
        local_188.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      }
      local_188._M_string_length = pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_188._M_dataplus._M_p,local_188._M_string_length);
      std::endl<char,std::char_traits<char>>(poVar8);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      pbVar9 = &local_1d0;
      goto LAB_00111a7f;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_1d0._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_00160a08;
    console_format_abi_cxx11_
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
               (Disa *)0x0,(Log_Level)&local_1d0,psVar12);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_218._0_8_,local_218._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"Partition size is bigger than graph vertex size.",0x30);
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_1d0._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_001609f0;
    console_format_abi_cxx11_
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
               (Disa *)0x0,(Log_Level)&local_1d0,psVar12);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_218._0_8_,local_218._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"Partition vertices are not unique.",0x22);
    std::endl<char,std::char_traits<char>>(poVar8);
  }
LAB_00111a7a:
  pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218;
LAB_00111a7f:
  std::__cxx11::string::~string((string *)pbVar9);
  exit(1);
}

Assistant:

Adjacency_Subgraph::Adjacency_Subgraph(const Adjacency_Graph<false>& parent_graph,
                                       const std::vector<std::size_t>& i_partition_local_global,
                                       const std::size_t extra_levels) {
#ifdef DISA_DEBUG
  std::vector<std::size_t> unique_check;
  std::unique_copy(i_partition_local_global.begin(), i_partition_local_global.end(), std::back_inserter(unique_check));
  ASSERT(unique_check.size() == i_partition_local_global.size(), "Partition vertices are not unique.");
  ASSERT(i_partition_local_global.size() <= parent_graph.size_vertex(),
         "Partition size is bigger than graph vertex size.");
  ASSERT(
  !std::any_of(i_partition_local_global.begin(), i_partition_local_global.end(),
               [&](const std::size_t i_global) { return i_global >= parent_graph.size_vertex(); }),
  "A global vertex is not in the parsed parent graph range [0, " + std::to_string(parent_graph.size_vertex()) + ").");
#endif

  hash_parent = std::hash<Adjacency_Graph<false>>{}(parent_graph);
  graph = parent_graph;
  reserve(i_partition_local_global.size());

  // Copy the contents of the graph into the sub-graph and set up axillary containers.
  std::size_t i_local_vertex = 0;
  std::vector<std::size_t> i_global_local(parent_graph.size_vertex(), std::numeric_limits<std::size_t>::max());
  FOR_EACH(i_global_vertex, i_partition_local_global) {
    i_local_global.push_back(i_global_vertex);
    i_global_local[i_global_vertex] = i_local_vertex;
    ++i_local_vertex;
  }

  // Remove vertices not in this subgraph.
  auto not_in_subgraph = [&](const std::size_t& vertex) {
    return i_global_local[vertex] == std::numeric_limits<std::size_t>::max();
  };
  graph.erase_if(not_in_subgraph);

  // Add back additional levels as needed.
  if(extra_levels != 0)
    update_levels(parent_graph, extra_levels, std::make_shared<std::vector<std::size_t>>(i_global_local));
}